

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# newpfor.h
# Opt level: O2

void __thiscall
FastPForLib::NewPFor<4U,_FastPForLib::Simple16<false>_>::encodeBlock
          (NewPFor<4U,_FastPForLib::Simple16<false>_> *this,uint32_t *in,uint32_t *out,
          size_t *nvalue)

{
  pointer puVar1;
  pointer puVar2;
  pointer puVar3;
  uint32_t *puVar4;
  uint32_t *in_00;
  sbyte sVar5;
  uint32_t i_2;
  uint bit;
  uint uVar6;
  long lVar7;
  ulong uVar8;
  uint32_t uVar9;
  uint32_t i;
  long lVar10;
  int iVar11;
  ulong uVar12;
  size_t encodedExceptions_sz;
  
  bit = (*(this->super_IntegerCODEC)._vptr_IntegerCODEC[9])(this,in,0x80);
  if (bit < 0x20) {
    encodedExceptions_sz = 0;
    puVar1 = (this->tobecoded).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_start;
    puVar2 = (this->exceptionsPositions).
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    puVar3 = (this->exceptionsValues).
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    sVar5 = ((byte)bit < 0x21) * (' ' - (byte)bit);
    uVar12 = 0;
    for (lVar10 = 0; iVar11 = (int)uVar12, lVar10 != 0x80; lVar10 = lVar10 + 1) {
      uVar6 = in[lVar10];
      if (uVar6 < (uint)(1 << (bit & 0x1f))) {
        puVar1[lVar10] = uVar6;
        uVar8 = uVar12;
      }
      else {
        uVar8 = (ulong)(iVar11 + 1);
        puVar1[lVar10] = uVar6 & (uint)(-1 << sVar5) >> sVar5;
        puVar2[uVar12] = (uint)lVar10;
        puVar3[uVar12] = in[lVar10] >> (bit & 0x1f);
      }
      uVar12 = uVar8;
    }
    if (iVar11 == 0) {
      uVar6 = 0 << (bit & 0x1f);
    }
    else {
      puVar1 = (this->exceptionsPositions).
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start;
      for (uVar8 = uVar12; uVar8 != 1; uVar8 = uVar8 - 1) {
        puVar2 = puVar1 + (uVar8 - 1);
        *puVar2 = *puVar2 - puVar1[(int)uVar8 - 2];
      }
      puVar4 = (this->exceptionsPositions).
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start;
      in_00 = (this->exceptions).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_start;
      for (uVar8 = 0; uVar12 != uVar8; uVar8 = uVar8 + 1) {
        if (uVar8 == 0) {
          uVar9 = *puVar4;
        }
        else {
          uVar9 = puVar4[uVar8] - 1;
        }
        in_00[uVar8] = uVar9;
        in_00[(uint)(iVar11 + (int)uVar8)] = puVar3[uVar8] - 1;
      }
      Simple16<false>::encodeArray
                (&this->ecoder,in_00,(ulong)(uint)(iVar11 * 2),out + 1,&encodedExceptions_sz);
      uVar6 = (uint)encodedExceptions_sz;
    }
    lVar7 = 0;
    lVar10 = (ulong)uVar6 * 4 + 4;
    *out = uVar6 | iVar11 << 0x10 | bit << 0x1a;
    for (uVar12 = 0; uVar12 < 0x80; uVar12 = uVar12 + 0x20) {
      fastpackwithoutmask((uint32_t *)
                          ((long)(this->tobecoded).
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_start + lVar7),
                          (uint32_t *)((long)out + lVar10),bit);
      lVar7 = lVar7 + 0x80;
      lVar10 = lVar10 + (ulong)bit * 4;
    }
    *nvalue = lVar10 >> 2;
  }
  else {
    *out = bit << 0x1a;
    for (lVar10 = 0; lVar10 != 0x80; lVar10 = lVar10 + 1) {
      out[lVar10 + 1] = in[lVar10];
    }
    *nvalue = 0x81;
  }
  return;
}

Assistant:

void NewPFor<BlockSizeInUnitsOfPackSize, ExceptionCoder>::encodeBlock(
    const uint32_t *in, uint32_t *out, size_t &nvalue) {
  const uint32_t len = BlockSize;

  uint32_t b = findBestB(in, len);
  if (b < 32) {

    uint32_t nExceptions = 0;
    size_t encodedExceptions_sz = 0;

    const uint32_t *const initout(out);
    for (uint32_t i = 0; i < len; i++) {

      if (in[i] >= (1U << b)) {
        tobecoded[i] = in[i] & ((1U << b) - 1);
        exceptionsPositions[nExceptions] = i;
        exceptionsValues[nExceptions] = (in[i] >> b);
        nExceptions++;
      } else {
        tobecoded[i] = in[i];
      }
    }

    if (nExceptions > 0) {

      for (uint32_t i = nExceptions - 1; i > 0; i--) {
        const uint32_t cur = exceptionsPositions[i];
        const uint32_t prev = exceptionsPositions[i - 1];

        exceptionsPositions[i] = cur - prev;
      }

      for (uint32_t i = 0; i < nExceptions; i++) {

        exceptions[i] =
            (i > 0) ? exceptionsPositions[i] - 1 : exceptionsPositions[i];
        exceptions[i + nExceptions] = exceptionsValues[i] - 1;
      }
    }

    if (nExceptions > 0)
      ecoder.encodeArray(&exceptions[0], 2 * nExceptions, out + 1,
                         encodedExceptions_sz);
    *out++ = (b << (PFORDELTA_NEXCEPT + PFORDELTA_EXCEPTSZ)) |
             (nExceptions << PFORDELTA_EXCEPTSZ) |
             static_cast<uint32_t>(encodedExceptions_sz);
    /* Write exceptional values */

    out += static_cast<uint32_t>(encodedExceptions_sz);
    for (uint32_t i = 0; i < len; i += 32) {
      fastpackwithoutmask(&tobecoded[i], out, b);
      out += b;
    }
    nvalue = out - initout;

  } else {
    *out++ = (b << (PFORDELTA_NEXCEPT + PFORDELTA_EXCEPTSZ));
    for (uint32_t i = 0; i < len; i++)
      out[i] = in[i];
    nvalue = len + 1;
  }
}